

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall
TTD::EventLog::RecordJsRTEquals
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var var1,Var var2,
          bool doStrict)

{
  EventLogEntry *pEVar1;
  undefined3 in_register_00000081;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *local_38;
  JsRTDoubleVarSingleScalarArgumentAction *gpAction;
  
  local_38 = (JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *)0x0;
  pEVar1 = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,1ul>,(TTD::NSLogEvents::EventKind)47>
                     (this,&local_38);
  local_38->VarArray[0] = var1;
  local_38->VarArray[1] = var2;
  local_38->ScalarArray[0] = (ulong)CONCAT31(in_register_00000081,doStrict);
  if (actionPopper->m_actionEvent == (EventLogEntry *)0x0) {
    actionPopper->m_actionEvent = pEVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Don\'t double initialize");
}

Assistant:

void EventLog::RecordJsRTEquals(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var var1, Js::Var var2, bool doStrict)
    {
        NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction* gpAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTDoubleVarSingleScalarArgumentAction, NSLogEvents::EventKind::EqualsActionTag>(&gpAction);
        NSLogEvents::SetVarItem_0(gpAction, TTD_CONVERT_JSVAR_TO_TTDVAR(var1));
        NSLogEvents::SetVarItem_1(gpAction, TTD_CONVERT_JSVAR_TO_TTDVAR(var2));
        NSLogEvents::SetScalarItem_0(gpAction, doStrict);

        actionPopper.InitializeWithEventAndEnter(evt);
    }